

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::schema::Type::Builder::initEnum(Builder *__return_storage_ptr__,Builder *this)

{
  StructBuilder base;
  uint uVar1;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = bounded<0u>();
  _::StructBuilder::setDataField<capnp::schema::Type::Which>(&this->_builder,uVar1,ENUM);
  uVar1 = bounded<1u>();
  _::StructBuilder::setDataField<unsigned_long>(&this->_builder,uVar1,0);
  uVar1 = bounded<0u>();
  _::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  _::PointerBuilder::clear(&local_28);
  memcpy(&local_50,this,0x28);
  base.capTable = (CapTableBuilder *)uStack_48;
  base.segment = (SegmentBuilder *)local_50;
  base.data = (void *)local_40;
  base.pointers = (WirePointer *)uStack_38;
  base.dataSize = (undefined4)local_30;
  base.pointerCount = local_30._4_2_;
  base._38_2_ = local_30._6_2_;
  Enum::Builder::Builder(__return_storage_ptr__,base);
  return __return_storage_ptr__;
}

Assistant:

inline typename Type::Enum::Builder Type::Builder::initEnum() {
  _builder.setDataField<Type::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Type::ENUM);
  _builder.setDataField< ::uint64_t>(::capnp::bounded<1>() * ::capnp::ELEMENTS, 0);
  _builder.getPointerField(::capnp::bounded<0>() * ::capnp::POINTERS).clear();
  return typename Type::Enum::Builder(_builder);
}